

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOAidFunction.cpp
# Opt level: O0

char * catStrIntStr(char *c1,int ss,char *c2)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  char local_98 [8];
  char tmp [100];
  char *str3;
  int len2;
  int len1;
  char *c2_local;
  int ss_local;
  char *c1_local;
  
  sVar1 = strlen(c1);
  sVar2 = strlen(c2);
  uVar3 = (ulong)((int)sVar1 + (int)sVar2 + 10);
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  register0x00000000 = (char *)operator_new__(uVar3);
  strcpy(register0x00000000,c1);
  sprintf(local_98,"%d",(ulong)(uint)ss);
  strcat(stack0xffffffffffffffd0,local_98);
  strcat(stack0xffffffffffffffd0,c2);
  return stack0xffffffffffffffd0;
}

Assistant:

char *catStrIntStr(const char *c1, int ss,const char *c2){
    int len1 = strlen(c1), len2 = strlen(c2);
    char *str3;
    str3 = new char [len1+len2+10];
    strcpy(str3, c1);
    char tmp[100];
    sprintf(tmp, "%d", ss);
    strcat(str3, tmp);
    strcat(str3, c2);

    return str3;
}